

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O1

void InitParametersFromDefinitions
               (InternalEffectDefinitionRegistrationCallback registereffectdefcallback,float *params
               )

{
  long lVar1;
  ulong uVar2;
  UnityAudioEffectDefinition definition;
  UnityAudioEffectDefinition local_a0;
  
  memset(&local_a0,0,0x88);
  (*registereffectdefcallback)(&local_a0);
  if (local_a0.numparameters != 0) {
    lVar1 = 0xc;
    uVar2 = 0;
    do {
      params[uVar2] = *(float *)((local_a0.paramdefs)->name + lVar1 * 4);
      if (*(void **)((local_a0.paramdefs)->name + lVar1 * 4 + -0x10) != (void *)0x0) {
        operator_delete__(*(void **)((local_a0.paramdefs)->name + lVar1 * 4 + -0x10));
      }
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (uVar2 < local_a0.numparameters);
  }
  if (local_a0.paramdefs != (UnityAudioParameterDefinition *)0x0) {
    operator_delete__(local_a0.paramdefs);
  }
  return;
}

Assistant:

void InitParametersFromDefinitions(
    InternalEffectDefinitionRegistrationCallback registereffectdefcallback,
    float* params
    )
{
    UnityAudioEffectDefinition definition;
    memset(&definition, 0, sizeof(definition));
    registereffectdefcallback(definition);
    for (UInt32 n = 0; n < definition.numparameters; n++)
    {
        params[n] = definition.paramdefs[n].defaultval;
        delete[] definition.paramdefs[n].description;
    }
    delete[] definition.paramdefs; // assumes that definition.paramdefs was allocated by registereffectdefcallback or is NULL
}